

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzDD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  uVar12 = (ulong)off;
  dVar13 = c;
  (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])();
  if ((long)uVar12 <
      (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    if ((long)uVar12 <
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      dVar13 = dVar13 * c;
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar12];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar10[uVar12];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar13;
      auVar1 = vfmadd213sd_fma(auVar23,auVar14,auVar1);
      pdVar10[uVar12] = auVar1._0_8_;
      (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])
                (this);
      uVar12 = (ulong)(off + 1);
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar12) goto LAB_00654542;
      if ((long)uVar12 <
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        dVar13 = dVar13 * c;
        auVar24._8_8_ = 0;
        auVar24._0_8_ =
             (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar12];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar10[uVar12];
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar13;
        auVar1 = vfmadd213sd_fma(auVar24,auVar15,auVar2);
        pdVar10[uVar12] = auVar1._0_8_;
        (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])
                  (this);
        uVar12 = (ulong)(off + 2);
        if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar12) goto LAB_00654542;
        if ((long)uVar12 <
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
          pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar12];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar10[uVar12];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar13 * c;
          auVar1 = vfmadd213sd_fma(auVar25,auVar16,auVar3);
          pdVar10[uVar12] = auVar1._0_8_;
          iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                     _vptr_ChNodeFEAbase[0x23])(this);
          if (0 < (long)((undefined8 *)CONCAT44(extraout_var,iVar11))[1]) {
            uVar12 = (ulong)(off + 3);
            if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)uVar12) goto LAB_00654542;
            if ((long)uVar12 <
                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               ) {
              pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar12];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar10[uVar12];
              auVar17._8_8_ = 0;
              auVar17._0_8_ = c * **(double **)CONCAT44(extraout_var,iVar11);
              auVar1 = vfmadd213sd_fma(auVar26,auVar17,auVar4);
              pdVar10[uVar12] = auVar1._0_8_;
              iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                         _vptr_ChNodeFEAbase[0x23])(this);
              if (1 < ((long *)CONCAT44(extraout_var_00,iVar11))[1]) {
                uVar12 = (ulong)(off + 4);
                if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows <= (long)uVar12) goto LAB_00654542;
                if ((long)uVar12 <
                    (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
                  pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ =
                       (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data[uVar12];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar10[uVar12];
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = c * *(double *)(*(long *)CONCAT44(extraout_var_00,iVar11) + 8);
                  auVar1 = vfmadd213sd_fma(auVar27,auVar18,auVar5);
                  pdVar10[uVar12] = auVar1._0_8_;
                  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                             _vptr_ChNodeFEAbase[0x23])(this);
                  if (2 < ((long *)CONCAT44(extraout_var_01,iVar11))[1]) {
                    uVar12 = (ulong)(off + 5);
                    if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows <= (long)uVar12) goto LAB_00654542;
                    if ((long)uVar12 <
                        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows) {
                      pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_data;
                      auVar28._8_8_ = 0;
                      auVar28._0_8_ =
                           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[uVar12];
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar10[uVar12];
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ =
                           c * *(double *)(*(long *)CONCAT44(extraout_var_01,iVar11) + 0x10);
                      auVar1 = vfmadd213sd_fma(auVar28,auVar19,auVar6);
                      pdVar10[uVar12] = auVar1._0_8_;
                      iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                                 _vptr_ChNodeFEAbase[0x2e])(this);
                      if (0 < (long)((undefined8 *)CONCAT44(extraout_var_02,iVar11))[1]) {
                        uVar12 = (ulong)(off + 6);
                        if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_rows <= (long)uVar12) goto LAB_00654542;
                        if ((long)uVar12 <
                            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_rows) {
                          pdVar10 = (R->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data;
                          auVar29._8_8_ = 0;
                          auVar29._0_8_ =
                               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[uVar12];
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = pdVar10[uVar12];
                          auVar20._8_8_ = 0;
                          auVar20._0_8_ = c * **(double **)CONCAT44(extraout_var_02,iVar11);
                          auVar1 = vfmadd213sd_fma(auVar29,auVar20,auVar7);
                          pdVar10[uVar12] = auVar1._0_8_;
                          iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.
                                     super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x2e])(this);
                          if (1 < ((long *)CONCAT44(extraout_var_03,iVar11))[1]) {
                            uVar12 = (ulong)(off + 7);
                            if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows <= (long)uVar12) goto LAB_00654542;
                            if ((long)uVar12 <
                                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows) {
                              pdVar10 = (R->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        ).m_storage.m_data;
                              auVar30._8_8_ = 0;
                              auVar30._0_8_ =
                                   (w->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data[uVar12];
                              auVar8._8_8_ = 0;
                              auVar8._0_8_ = pdVar10[uVar12];
                              auVar21._8_8_ = 0;
                              auVar21._0_8_ =
                                   c * *(double *)(*(long *)CONCAT44(extraout_var_03,iVar11) + 8);
                              auVar1 = vfmadd213sd_fma(auVar30,auVar21,auVar8);
                              pdVar10[uVar12] = auVar1._0_8_;
                              iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.
                                         super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x2e])(this);
                              if (2 < ((long *)CONCAT44(extraout_var_04,iVar11))[1]) {
                                uVar12 = (ulong)(off + 8);
                                if ((w->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_rows <= (long)uVar12) goto LAB_00654542;
                                if ((long)uVar12 <
                                    (R->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_rows) {
                                  auVar22._8_8_ = 0;
                                  auVar22._0_8_ =
                                       (w->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data[uVar12];
                                  pdVar10 = (R->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data;
                                  auVar9._8_8_ = 0;
                                  auVar9._0_8_ = pdVar10[uVar12];
                                  auVar31._8_8_ = 0;
                                  auVar31._0_8_ =
                                       c * *(double *)
                                            (*(long *)CONCAT44(extraout_var_04,iVar11) + 0x10);
                                  auVar1 = vfmadd213sd_fma(auVar31,auVar22,auVar9);
                                  pdVar10[uVar12] = auVar1._0_8_;
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_00654542:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChNodeFEAxyzDD::NodeIntLoadResidual_Mv(const unsigned int off,
                                            ChVectorDynamic<>& R,
                                            const ChVectorDynamic<>& w,
                                            const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
    R(off + 6) += c * GetMassDiagonalDD()(0) * w(off + 6);
    R(off + 7) += c * GetMassDiagonalDD()(1) * w(off + 7);
    R(off + 8) += c * GetMassDiagonalDD()(2) * w(off + 8);
}